

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_fold.c
# Opt level: O2

void emit_fold(BuildCtx *ctx)

{
  uint32_t uVar1;
  FILE *__stream;
  BuildCtx *pBVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  FILE *__stream_00;
  char *pcVar7;
  ulong uVar8;
  size_t sVar9;
  int *piVar10;
  char *pcVar11;
  uint uVar12;
  uint uVar13;
  uint *puVar14;
  uint uVar15;
  uint32_t uVar16;
  size_t sStack_8150;
  undefined8 local_8140;
  char buf [256];
  char *local_8038 [4097];
  
  pcVar7 = *ctx->args;
  if (pcVar7 == (char *)0x0) {
    pcVar7 = "Error: missing input filename\n";
    sStack_8150 = 0x1e;
  }
  else {
    if (((*pcVar7 != '-') || (__stream_00 = _stdin, pcVar7[1] != '\0')) &&
       (__stream_00 = fopen(pcVar7,"r"), __stream = _stderr, __stream_00 == (FILE *)0x0)) {
      piVar10 = __errno_location();
      pcVar11 = strerror(*piVar10);
      fprintf(__stream,"Error: cannot open input file \'%s\': %s\n",pcVar7,pcVar11);
      goto LAB_0010969d;
    }
    fwrite("/* This is a generated file. DO NOT EDIT! */\n\n",0x2e,1,(FILE *)ctx->fp);
    fwrite("static const FoldFunc fold_func[] = {\n",0x26,1,(FILE *)ctx->fp);
    lineno = 0;
    funcidx = 0;
    nkeys = 0;
    local_8140 = ctx;
    while (pcVar7 = fgets(buf,0x100,__stream_00), pcVar7 != (char *)0x0) {
      uVar12 = lineno + 1;
      lineno = uVar12;
      iVar3 = bcmp(buf,"LJFOLD",6);
      if (iVar3 == 0) {
        pcVar7 = strchr(buf + 6,0x29);
        if (pcVar7 == (char *)0x0 || buf[6] != '(') {
          if (((buf[6] != 'X') && (buf[6] != 'F')) || ((buf[7] != '(' || (pcVar7 == (char *)0x0))))
          {
            sVar9 = strlen(buf);
            buf[sVar9 - 1] = '\0';
            fprintf(_stderr,"Error: unknown fold definition tag %s%s at line %d\n","LJFOLD",buf + 6,
                    (ulong)uVar12);
            goto LAB_0010969d;
          }
          *pcVar7 = '\0';
          if (funcidx != 0) {
            fwrite(",\n",2,1,(FILE *)ctx->fp);
          }
          pcVar7 = "  fold_%s";
          if (buf[6] == 'X') {
            pcVar7 = "  %s";
          }
          fprintf((FILE *)ctx->fp,pcVar7,buf + 8);
          funcidx = funcidx + 1;
        }
        else {
          *pcVar7 = '\0';
          local_8038[0] = buf + 7;
          uVar4 = nexttoken(local_8038,0,0);
          uVar5 = nexttoken(local_8038,0,0x7f);
          uVar6 = nexttoken(local_8038,1,0x3ff);
          uVar1 = nkeys;
          uVar16 = funcidx;
          uVar8 = (ulong)nkeys;
          if (0xfff < uVar8) {
            pcVar7 = "Error: too many fold rules, increase BUILD_MAX_FOLD.\n";
            sStack_8150 = 0x35;
            goto LAB_001096ef;
          }
          uVar12 = uVar5 << 10 | uVar4 << 0x11 | uVar6;
          uVar13 = uVar12 & 0xffffff;
          puVar14 = foldkeys + uVar8;
          for (; uVar8 != 0; uVar8 = uVar8 - 1) {
            uVar15 = foldkeys[(int)uVar8 - 1] & 0xffffff;
            if (uVar15 < uVar13) break;
            if (uVar15 == uVar13) {
              fprintf(_stderr,"Error: duplicate fold definition at line %d\n",(ulong)(uint)lineno);
              goto LAB_0010969d;
            }
            *puVar14 = foldkeys[(int)uVar8 - 1];
            puVar14 = puVar14 + -1;
          }
          foldkeys[uVar8 & 0xffffffff] = uVar12 | uVar16 << 0x18;
          nkeys = uVar1 + 1;
          ctx = local_8140;
        }
      }
    }
    fclose(__stream_00);
    fwrite("\n};\n\n",5,1,(FILE *)ctx->fp);
    pcVar7 = "#define fold_hashkey(k)\t(((((k)<<%u)-(k))<<%u)%%%u)\n\n";
    for (uVar12 = nkeys | 1; uVar12 < 0x2000; uVar12 = uVar12 + 2) {
      uVar8 = 0;
      while (uVar16 = (uint32_t)uVar8, uVar16 != 0x400) {
        iVar3 = tryhash((uint32_t *)local_8038,uVar12,uVar16,0);
        if (iVar3 != 0) goto LAB_00109629;
        uVar8 = (ulong)(uVar16 + 1);
      }
      uVar8 = 0;
      while (uVar16 = (uint32_t)uVar8, uVar16 != 0x400) {
        iVar3 = tryhash((uint32_t *)local_8038,uVar12,uVar16,1);
        if (iVar3 != 0) {
          pcVar7 = "#define fold_hashkey(k)\t(lj_rol(lj_rol((k),%u)-(k),%u)%%%u)\n\n";
LAB_00109629:
          pBVar2 = local_8140;
          printhash(local_8140,(uint32_t *)local_8038,uVar12);
          fprintf((FILE *)pBVar2->fp,pcVar7,uVar8 >> 5,(ulong)((uint)uVar8 & 0x1f),(ulong)uVar12);
          return;
        }
        uVar8 = (ulong)(uVar16 + 1);
      }
    }
    pcVar7 = "Error: search for perfect hash failed\n";
    sStack_8150 = 0x26;
  }
LAB_001096ef:
  fwrite(pcVar7,sStack_8150,1,_stderr);
LAB_0010969d:
  exit(1);
}

Assistant:

void emit_fold(BuildCtx *ctx)
{
  char buf[256];  /* We don't care about analyzing lines longer than that. */
  const char *fname = ctx->args[0];
  FILE *fp;

  if (fname == NULL) {
    fprintf(stderr, "Error: missing input filename\n");
    exit(1);
  }

  if (fname[0] == '-' && fname[1] == '\0') {
    fp = stdin;
  } else {
    fp = fopen(fname, "r");
    if (!fp) {
      fprintf(stderr, "Error: cannot open input file '%s': %s\n",
	      fname, strerror(errno));
      exit(1);
    }
  }

  fprintf(ctx->fp, "/* This is a generated file. DO NOT EDIT! */\n\n");
  fprintf(ctx->fp, "static const FoldFunc fold_func[] = {\n");

  lineno = 0;
  funcidx = 0;
  nkeys = 0;
  while (fgets(buf, sizeof(buf), fp) != NULL) {
    lineno++;
    /* The prefix must be at the start of a line, otherwise it's ignored. */
    if (!strncmp(buf, FOLDDEF_PREFIX, sizeof(FOLDDEF_PREFIX)-1)) {
      char *p = buf+sizeof(FOLDDEF_PREFIX)-1;
      char *q = strchr(p, ')');
      if (p[0] == '(' && q) {
	p++;
	*q = '\0';
	foldrule(p);
      } else if ((p[0] == 'F' || p[0] == 'X') && p[1] == '(' && q) {
	p += 2;
	*q = '\0';
	if (funcidx)
	  fprintf(ctx->fp, ",\n");
	if (p[-2] == 'X')
	  fprintf(ctx->fp, "  %s", p);
	else
	  fprintf(ctx->fp, "  fold_%s", p);
	funcidx++;
      } else {
	buf[strlen(buf)-1] = '\0';
	fprintf(stderr, "Error: unknown fold definition tag %s%s at line %d\n",
		FOLDDEF_PREFIX, p, lineno);
	exit(1);
      }
    }
  }
  fclose(fp);
  fprintf(ctx->fp, "\n};\n\n");

  makehash(ctx);
}